

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

bool __thiscall google::protobuf::internal::SooRep::is_soo(SooRep *this)

{
  bool bVar1;
  SooRep *this_local;
  
  bVar1 = ShortSooRep::is_soo((ShortSooRep *)this);
  return bVar1;
}

Assistant:

bool is_soo() const {
    static_assert(sizeof(LongSooRep) == sizeof(ShortSooRep), "");
    static_assert(offsetof(SooRep, long_rep) == offsetof(SooRep, short_rep),
                  "");
    static_assert(offsetof(LongSooRep, elements_int) ==
                      offsetof(ShortSooRep, arena_and_size),
                  "");
    return short_rep.is_soo();
  }